

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O3

void __thiscall
duckdb::StandardBufferManager::WriteTemporaryBuffer
          (StandardBufferManager *this,MemoryTag tag,block_id_t block_id,FileBuffer *buffer)

{
  pointer pBVar1;
  idx_t iVar2;
  idx_t iVar3;
  pointer pTVar4;
  type pTVar5;
  FileSystem *pFVar6;
  pointer this_00;
  type handle;
  undefined7 in_register_00000031;
  ulong uVar7;
  string path;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_60;
  block_id_t local_58;
  string local_50;
  
  local_58 = block_id;
  RequireTemporaryDirectory(this);
  iVar3 = buffer->internal_size;
  pBVar1 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
           operator->(&this->temp_block_manager);
  iVar2 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
  uVar7 = CONCAT71(in_register_00000031,tag) & 0xffffffff;
  if (iVar3 == iVar2) {
    pBVar1 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
             operator->(&this->temp_block_manager);
    iVar3 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
    LOCK();
    this->evicted_data_per_tag[uVar7].super___atomic_base<unsigned_long>._M_i =
         this->evicted_data_per_tag[uVar7].super___atomic_base<unsigned_long>._M_i + iVar3;
    UNLOCK();
    pTVar4 = unique_ptr<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>,_true>
             ::operator->(&(this->temporary_directory).handle);
    pTVar5 = unique_ptr<duckdb::TemporaryFileManager,_std::default_delete<duckdb::TemporaryFileManager>,_true>
             ::operator*(&pTVar4->temp_file);
    TemporaryFileManager::WriteTemporaryBuffer(pTVar5,local_58,buffer);
    return;
  }
  GetTemporaryPath_abi_cxx11_(&local_50,this,local_58);
  LOCK();
  this->evicted_data_per_tag[uVar7].super___atomic_base<unsigned_long>._M_i =
       this->evicted_data_per_tag[uVar7].super___atomic_base<unsigned_long>._M_i +
       buffer->internal_size;
  UNLOCK();
  pFVar6 = FileSystem::GetFileSystem(this->db);
  (*pFVar6->_vptr_FileSystem[2])(&local_60,pFVar6,&local_50,10,0x100,0);
  pTVar4 = unique_ptr<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>,_true>
           ::operator->(&(this->temporary_directory).handle);
  pTVar5 = unique_ptr<duckdb::TemporaryFileManager,_std::default_delete<duckdb::TemporaryFileManager>,_true>
           ::operator*(&pTVar4->temp_file);
  TemporaryFileManager::IncreaseSizeOnDisk(pTVar5,buffer->internal_size + 8);
  this_00 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
            operator->((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                        *)&local_60);
  FileHandle::Write(this_00,&buffer->size,8,0);
  handle = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator*
                     ((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                       *)&local_60);
  FileBuffer::Write(buffer,handle,8);
  if (local_60._M_head_impl != (FileHandle *)0x0) {
    (*(local_60._M_head_impl)->_vptr_FileHandle[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void StandardBufferManager::WriteTemporaryBuffer(MemoryTag tag, block_id_t block_id, FileBuffer &buffer) {

	// WriteTemporaryBuffer assumes that we never write a buffer below DEFAULT_BLOCK_ALLOC_SIZE.
	RequireTemporaryDirectory();

	// Append to a few grouped files.
	if (buffer.AllocSize() == GetBlockAllocSize()) {
		evicted_data_per_tag[uint8_t(tag)] += GetBlockAllocSize();
		temporary_directory.handle->GetTempFile().WriteTemporaryBuffer(block_id, buffer);
		return;
	}

	// Get the path to write to.
	auto path = GetTemporaryPath(block_id);
	evicted_data_per_tag[uint8_t(tag)] += buffer.AllocSize();

	// Create the file and write the size followed by the buffer contents.
	auto &fs = FileSystem::GetFileSystem(db);
	auto handle = fs.OpenFile(path, FileFlags::FILE_FLAGS_WRITE | FileFlags::FILE_FLAGS_FILE_CREATE);
	temporary_directory.handle->GetTempFile().IncreaseSizeOnDisk(buffer.AllocSize() + sizeof(idx_t));
	handle->Write(&buffer.size, sizeof(idx_t), 0);
	buffer.Write(*handle, sizeof(idx_t));
}